

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall UnifiedRegex::CharSet<char16_t>::Get_helper(CharSet<char16_t> *this,uint k)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte bVar4;
  undefined **ppuVar5;
  uint uVar6;
  
  ppuVar5 = (undefined **)(this->rep).compact.countPlusOne;
  if ((undefined1 *)((long)ppuVar5 + -1) < &DAT_00000005) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x511,"(!IsCompact())","!IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    ppuVar5 = (undefined **)(this->rep).compact.countPlusOne;
  }
  uVar6 = 3;
  bVar4 = 0xc;
  while( true ) {
    bVar2 = ppuVar5 == &CharSetFull::Instance;
    if (bVar2) {
      return bVar2;
    }
    ppuVar5 = (undefined **)ppuVar5[(ulong)(k >> (bVar4 & 0x1f) & 0xf) + 1];
    if (ppuVar5 == (undefined **)0x0) break;
    uVar6 = uVar6 - 1;
    bVar4 = bVar4 - 4;
    if (uVar6 < 2) {
      if (ppuVar5 == &CharSetFull::Instance) {
        bVar2 = true;
      }
      else {
        bVar2 = (*(uint *)((long)ppuVar5 + (ulong)(k >> 3 & 0x1c) + 8) >> (k & 0x1f) & 1) != 0;
      }
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool CharSet<char16>::Get_helper(uint k) const
    {
        Assert(!IsCompact());
        CharSetNode* curr = rep.full.root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }